

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PathDeclarationSyntax::PathDeclarationSyntax
          (PathDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,PathDescriptionSyntax *desc
          ,Token equals,Token openParen,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *delays
          ,Token closeParen,Token semi)

{
  bool bVar1;
  PathDescriptionSyntax *pPVar2;
  ExpressionSyntax *pEVar3;
  SyntaxNode *in_RCX;
  PathDescriptionSyntax *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *rhs;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *this_00;
  undefined1 in_stack_ffffffffffffffa0 [16];
  MemberSyntax *in_stack_ffffffffffffffb0;
  PathDescriptionSyntax *local_38 [2];
  PathDescriptionSyntax *local_28;
  SyntaxNode *local_10;
  undefined8 local_8;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&stack0x00000018;
  rhs = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&stack0x00000008;
  local_28 = in_RDX;
  local_10 = in_RCX;
  local_8 = in_R8;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0._12_4_,
             in_stack_ffffffffffffffa0._0_8_);
  local_38[0] = local_28;
  not_null<slang::syntax::PathDescriptionSyntax_*>::not_null<slang::syntax::PathDescriptionSyntax_*>
            ((not_null<slang::syntax::PathDescriptionSyntax_*> *)&in_RDI[3].parent,local_38);
  in_RDI[3].previewNode = local_10;
  *(undefined8 *)(in_RDI + 4) = local_8;
  in_RDI[4].parent = (SyntaxNode *)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[4].previewNode = *(SyntaxNode **)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList(this_00,rhs);
  in_RDI[7].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[7].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  *(ParentList **)(in_RDI + 8) = __end2.list;
  in_RDI[8].parent = (SyntaxNode *)__end2.index;
  pPVar2 = not_null<slang::syntax::PathDescriptionSyntax_*>::operator->
                     ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0x2a8f51);
  (pPVar2->super_SyntaxNode).parent = in_RDI;
  in_RDI[5].previewNode = in_RDI;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x2a8f77);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)this_00,(iterator_base<slang::syntax::ExpressionSyntax_*> *)rhs)
    ;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pEVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                          *)0x2a8fb6);
    (pEVar3->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

PathDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, PathDescriptionSyntax& desc, Token equals, Token openParen, const SeparatedSyntaxList<ExpressionSyntax>& delays, Token closeParen, Token semi) :
        MemberSyntax(SyntaxKind::PathDeclaration, attributes), desc(&desc), equals(equals), openParen(openParen), delays(delays), closeParen(closeParen), semi(semi) {
        this->desc->parent = this;
        this->delays.parent = this;
        for (auto child : this->delays)
            child->parent = this;
    }